

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O0

bool __thiscall crnlib::find_files::find(find_files *this,char *pSpec,uint flags)

{
  bool bVar1;
  char *pcVar2;
  char *pFilespec;
  undefined1 local_68 [8];
  dynamic_string find_filename;
  dynamic_string find_pathname;
  undefined1 local_38 [8];
  dynamic_string find_name;
  uint flags_local;
  char *pSpec_local;
  find_files *this_local;
  
  find_name.m_pStr._4_4_ = flags;
  dynamic_string::dynamic_string((dynamic_string *)local_38,pSpec);
  bVar1 = file_utils::full_path((dynamic_string *)local_38);
  if (bVar1) {
    dynamic_string::dynamic_string((dynamic_string *)&find_filename.m_pStr);
    dynamic_string::dynamic_string((dynamic_string *)local_68);
    pcVar2 = dynamic_string::get_ptr((dynamic_string *)local_38);
    bVar1 = file_utils::split_path
                      (pcVar2,(dynamic_string *)&find_filename.m_pStr,(dynamic_string *)local_68);
    if (bVar1) {
      pcVar2 = dynamic_string::get_ptr((dynamic_string *)&find_filename.m_pStr);
      pFilespec = dynamic_string::get_ptr((dynamic_string *)local_68);
      this_local._7_1_ = find(this,pcVar2,pFilespec,find_name.m_pStr._4_4_);
    }
    else {
      this_local._7_1_ = false;
    }
    dynamic_string::~dynamic_string((dynamic_string *)local_68);
    dynamic_string::~dynamic_string((dynamic_string *)&find_filename.m_pStr);
  }
  else {
    this_local._7_1_ = false;
  }
  dynamic_string::~dynamic_string((dynamic_string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool find_files::find(const char* pSpec, uint flags)
    {
        dynamic_string find_name(pSpec);

        if (!file_utils::full_path(find_name))
        {
            return false;
        }

        dynamic_string find_pathname, find_filename;
        if (!file_utils::split_path(find_name.get_ptr(), find_pathname, find_filename))
        {
            return false;
        }

        return find(find_pathname.get_ptr(), find_filename.get_ptr(), flags);
    }